

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdef.c
# Opt level: O0

mdef_t * mdef_init(char *mdeffile,int32 breport)

{
  ushort uVar1;
  int32 iVar2;
  int iVar3;
  FILE *__stream;
  hash_table_t *phVar4;
  ciphone_t *pcVar5;
  phone_t *ppVar6;
  uint16 **ppuVar7;
  ph_lc_t ***ppppVar8;
  int16 *piVar9;
  bool bVar10;
  mdef_t *m;
  int32 cd;
  int32 ci;
  int32 s;
  int p;
  uint16 **senmap;
  char buf [1024];
  char tag [1024];
  int32 n;
  int32 n_map;
  int32 n_tri;
  int32 n_ci;
  FILE *fp;
  int32 breport_local;
  char *mdeffile_local;
  
  if (mdeffile == (char *)0x0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c",
            0x200,"No mdef-file\n");
    exit(1);
  }
  if (breport != 0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c",
            0x203,"Reading model definition: %s\n",mdeffile);
  }
  mdeffile_local =
       (char *)__ckd_calloc__(1,0x60,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                              ,0x205);
  __stream = fopen(mdeffile,"r");
  if (__stream == (FILE *)0x0) {
    err_msg_system(ERR_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                   ,0x208,"Failed to open mdef file \'%s\' for reading",mdeffile);
    exit(1);
  }
  iVar2 = noncomment_line((char *)&senmap,0x400,(FILE *)__stream);
  if (iVar2 < 0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c",
            0x20b,"Empty file: %s\n",mdeffile);
    exit(1);
  }
  iVar3 = strncmp((char *)&senmap,"BMDF",4);
  if ((iVar3 == 0) || (iVar3 = strncmp((char *)&senmap,"FDMB",4), iVar3 == 0)) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c",
            0x210,"Found byte-order mark %.4s, assuming this is a binary mdef file\n",&senmap);
    fclose(__stream);
    ckd_free(mdeffile_local);
    mdeffile_local = (char *)0x0;
  }
  else {
    iVar3 = strncmp((char *)&senmap,"0.3",3);
    if (iVar3 != 0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
              ,0x217,"Version error: Expecting %s, but read %s\n","0.3",&senmap);
      exit(1);
    }
    n_map = -1;
    n = -1;
    tag[0x3fc] = -1;
    tag[0x3fd] = -1;
    tag[0x3fe] = -1;
    tag[0x3ff] = -1;
    ((mdef_t *)mdeffile_local)->n_ci_sen = -1;
    ((mdef_t *)mdeffile_local)->n_sen = -1;
    ((mdef_t *)mdeffile_local)->n_tmat = -1;
    do {
      iVar2 = noncomment_line((char *)&senmap,0x400,(FILE *)__stream);
      if (iVar2 < 0) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                ,0x222,"Incomplete header\n");
        exit(1);
      }
      iVar3 = __isoc99_sscanf(&senmap,"%d %s",tag + 0x3f8,buf + 0x3f8);
      if ((iVar3 != 2) || ((int)tag._1016_4_ < 0)) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                ,0x225,"Error in header: %s\n",&senmap);
        exit(1);
      }
      iVar3 = strcmp(buf + 0x3f8,"n_base");
      if (iVar3 == 0) {
        n_map._0_1_ = tag[0x3f8];
        n_map._1_1_ = tag[0x3f9];
        n_map._2_1_ = tag[0x3fa];
        n_map._3_1_ = tag[0x3fb];
      }
      else {
        iVar3 = strcmp(buf + 0x3f8,"n_tri");
        if (iVar3 == 0) {
          n._0_1_ = tag[0x3f8];
          n._1_1_ = tag[0x3f9];
          n._2_1_ = tag[0x3fa];
          n._3_1_ = tag[0x3fb];
        }
        else {
          iVar3 = strcmp(buf + 0x3f8,"n_state_map");
          if (iVar3 == 0) {
            tag[0x3fc] = tag[0x3f8];
            tag[0x3fd] = tag[0x3f9];
            tag[0x3fe] = tag[0x3fa];
            tag[0x3ff] = tag[0x3fb];
          }
          else {
            iVar3 = strcmp(buf + 0x3f8,"n_tied_ci_state");
            if (iVar3 == 0) {
              ((mdef_t *)mdeffile_local)->n_ci_sen = tag._1016_4_;
            }
            else {
              iVar3 = strcmp(buf + 0x3f8,"n_tied_state");
              if (iVar3 == 0) {
                ((mdef_t *)mdeffile_local)->n_sen = tag._1016_4_;
              }
              else {
                iVar3 = strcmp(buf + 0x3f8,"n_tied_tmat");
                if (iVar3 != 0) {
                  err_msg(ERR_FATAL,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                          ,0x234,"Unknown header line: %s\n",&senmap);
                  exit(1);
                }
                ((mdef_t *)mdeffile_local)->n_tmat = tag._1016_4_;
              }
            }
          }
        }
      }
      bVar10 = true;
      if ((((-1 < n_map) && (bVar10 = true, -1 < n)) && (bVar10 = true, -1 < (int)tag._1020_4_)) &&
         ((bVar10 = true, -1 < ((mdef_t *)mdeffile_local)->n_ci_sen &&
          (bVar10 = true, -1 < ((mdef_t *)mdeffile_local)->n_sen)))) {
        bVar10 = ((mdef_t *)mdeffile_local)->n_tmat < 0;
      }
    } while (bVar10);
    if (((n_map == 0) || (((mdef_t *)mdeffile_local)->n_ci_sen == 0)) ||
       ((((mdef_t *)mdeffile_local)->n_tmat == 0 ||
        (((mdef_t *)mdeffile_local)->n_sen < ((mdef_t *)mdeffile_local)->n_ci_sen)))) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
              ,0x23a,"%s: Error in header\n",mdeffile);
      exit(1);
    }
    if (0x7ffe < n_map) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
              ,0x23f,"%s: #CI phones (%d) exceeds limit (%d)\n",mdeffile,(ulong)(uint)n_map,0x7fff);
      exit(1);
    }
    if (0x7ffffffe < (long)n_map + (long)n) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
              ,0x242,"%s: #Phones (%d) exceeds limit (%d)\n",mdeffile,(ulong)(uint)(n_map + n),
              0x7fffffff);
      exit(1);
    }
    if (0x7ffe < ((mdef_t *)mdeffile_local)->n_sen) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
              ,0x245,"%s: #senones (%d) exceeds limit (%d)\n",mdeffile,
              (ulong)(uint)((mdef_t *)mdeffile_local)->n_sen,0x7fff);
      exit(1);
    }
    if (0x7ffffffe < ((mdef_t *)mdeffile_local)->n_tmat) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
              ,0x248,"%s: #tmats (%d) exceeds limit (%d)\n",mdeffile,
              (ulong)(uint)((mdef_t *)mdeffile_local)->n_tmat,0x7fffffff);
      exit(1);
    }
    ((mdef_t *)mdeffile_local)->n_emit_state = (int)tag._1020_4_ / (n_map + n) + -1;
    if ((((mdef_t *)mdeffile_local)->n_emit_state + 1) * (n_map + n) != tag._1020_4_) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
              ,0x24d,"Header error: n_state_map not a multiple of n_ci*n_tri\n");
      exit(1);
    }
    ((mdef_t *)mdeffile_local)->n_ciphone = n_map;
    phVar4 = hash_table_new(n_map,0);
    ((mdef_t *)mdeffile_local)->ciphone_ht = phVar4;
    pcVar5 = (ciphone_t *)
             __ckd_calloc__((long)n_map,0x10,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                            ,0x252);
    ((mdef_t *)mdeffile_local)->ciphone = pcVar5;
    ((mdef_t *)mdeffile_local)->n_phone = n_map + n;
    ppVar6 = (phone_t *)
             __ckd_calloc__((long)((mdef_t *)mdeffile_local)->n_phone,0x14,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                            ,0x256);
    ((mdef_t *)mdeffile_local)->phone = ppVar6;
    ppuVar7 = (uint16 **)
              __ckd_calloc_2d__((long)((mdef_t *)mdeffile_local)->n_phone,
                                (long)((mdef_t *)mdeffile_local)->n_emit_state,2,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                                ,0x259);
    ((mdef_t *)mdeffile_local)->sseq = ppuVar7;
    ppppVar8 = (ph_lc_t ***)
               __ckd_calloc_2d__(4,(long)((mdef_t *)mdeffile_local)->n_ciphone,8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                                 ,0x25d);
    ((mdef_t *)mdeffile_local)->wpos_ci_lclist = ppppVar8;
    for (ci = 0; ci < n_map; ci = ci + 1) {
      iVar2 = noncomment_line((char *)&senmap,0x400,(FILE *)__stream);
      if (iVar2 < 0) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                ,0x267,"Premature EOF reading CIphone %d\n",(ulong)(uint)ci);
        exit(1);
      }
      parse_base_line((mdef_t *)mdeffile_local,(char *)&senmap,ci);
    }
    iVar3 = mdef_ciphone_id((mdef_t *)mdeffile_local,"SIL");
    ((mdef_t *)mdeffile_local)->sil = (int16)iVar3;
    for (; ci < ((mdef_t *)mdeffile_local)->n_phone; ci = ci + 1) {
      iVar2 = noncomment_line((char *)&senmap,0x400,(FILE *)__stream);
      if (iVar2 < 0) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                ,0x26f,"Premature EOF reading phone %d\n",(ulong)(uint)ci);
        exit(1);
      }
      parse_tri_line((mdef_t *)mdeffile_local,(char *)&senmap,ci);
    }
    iVar2 = noncomment_line((char *)&senmap,0x400,(FILE *)__stream);
    if (-1 < iVar2) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
              ,0x275,"Non-empty file beyond expected #phones (%d)\n",
              (ulong)(uint)((mdef_t *)mdeffile_local)->n_phone);
    }
    if (((mdef_t *)mdeffile_local)->n_ciphone * ((mdef_t *)mdeffile_local)->n_emit_state !=
        ((mdef_t *)mdeffile_local)->n_ci_sen) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
              ,0x27b,"#CI-senones(%d) != #CI-phone(%d) x #emitting-states(%d)\n",
              (ulong)(uint)((mdef_t *)mdeffile_local)->n_ci_sen,
              (ulong)(uint)((mdef_t *)mdeffile_local)->n_ciphone,
              ((mdef_t *)mdeffile_local)->n_emit_state);
      exit(1);
    }
    piVar9 = (int16 *)__ckd_calloc__((long)((mdef_t *)mdeffile_local)->n_sen,2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                                     ,0x27c);
    ((mdef_t *)mdeffile_local)->cd2cisen = piVar9;
    piVar9 = (int16 *)__ckd_calloc__((long)((mdef_t *)mdeffile_local)->n_sen,2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                                     ,0x27e);
    ((mdef_t *)mdeffile_local)->sen2cimap = piVar9;
    for (cd = 0; cd < ((mdef_t *)mdeffile_local)->n_sen; cd = cd + 1) {
      ((mdef_t *)mdeffile_local)->sen2cimap[cd] = -1;
    }
    for (cd = 0; cd < ((mdef_t *)mdeffile_local)->n_ci_sen; cd = cd + 1) {
      ((mdef_t *)mdeffile_local)->cd2cisen[cd] = (int16)cd;
      ((mdef_t *)mdeffile_local)->sen2cimap[cd] =
           (int16)(cd / ((mdef_t *)mdeffile_local)->n_emit_state);
    }
    for (ci = n_map; ci < ((mdef_t *)mdeffile_local)->n_phone; ci = ci + 1) {
      for (cd = 0; cd < ((mdef_t *)mdeffile_local)->n_emit_state; cd = cd + 1) {
        uVar1 = ((mdef_t *)mdeffile_local)->sseq[ci][cd];
        ((mdef_t *)mdeffile_local)->cd2cisen[(int)(uint)uVar1] =
             ((mdef_t *)mdeffile_local)->sseq[((mdef_t *)mdeffile_local)->phone[ci].ci][cd];
        ((mdef_t *)mdeffile_local)->sen2cimap[(int)(uint)uVar1] =
             ((mdef_t *)mdeffile_local)->phone[ci].ci;
      }
    }
    sseq_compress((mdef_t *)mdeffile_local);
    fclose(__stream);
  }
  return (mdef_t *)mdeffile_local;
}

Assistant:

mdef_t *
mdef_init(char *mdeffile, int32 breport)
{
    FILE *fp;
    int32 n_ci, n_tri, n_map, n;
    __BIGSTACKVARIABLE__ char tag[1024], buf[1024];
    uint16 **senmap;
    int p;
    int32 s, ci, cd;
    mdef_t *m;

    if (!mdeffile)
        E_FATAL("No mdef-file\n");

    if (breport)
        E_INFO("Reading model definition: %s\n", mdeffile);

    m = (mdef_t *) ckd_calloc(1, sizeof(mdef_t));       /* freed in mdef_free */

    if ((fp = fopen(mdeffile, "r")) == NULL)
        E_FATAL_SYSTEM("Failed to open mdef file '%s' for reading", mdeffile);

    if (noncomment_line(buf, sizeof(buf), fp) < 0)
        E_FATAL("Empty file: %s\n", mdeffile);

    if (strncmp(buf, "BMDF", 4) == 0 || strncmp(buf, "FDMB", 4) == 0) {
        E_INFO
            ("Found byte-order mark %.4s, assuming this is a binary mdef file\n",
             buf);
        fclose(fp);
        ckd_free(m);
        return NULL;
    }
    if (strncmp(buf, MODEL_DEF_VERSION, strlen(MODEL_DEF_VERSION)) != 0)
        E_FATAL("Version error: Expecting %s, but read %s\n",
                MODEL_DEF_VERSION, buf);

    /* Read #base phones, #triphones, #senone mappings defined in header */
    n_ci = -1;
    n_tri = -1;
    n_map = -1;
    m->n_ci_sen = -1;
    m->n_sen = -1;
    m->n_tmat = -1;
    do {
        if (noncomment_line(buf, sizeof(buf), fp) < 0)
            E_FATAL("Incomplete header\n");

        if ((sscanf(buf, "%d %s", &n, tag) != 2) || (n < 0))
            E_FATAL("Error in header: %s\n", buf);

        if (strcmp(tag, "n_base") == 0)
            n_ci = n;
        else if (strcmp(tag, "n_tri") == 0)
            n_tri = n;
        else if (strcmp(tag, "n_state_map") == 0)
            n_map = n;
        else if (strcmp(tag, "n_tied_ci_state") == 0)
            m->n_ci_sen = n;
        else if (strcmp(tag, "n_tied_state") == 0)
            m->n_sen = n;
        else if (strcmp(tag, "n_tied_tmat") == 0)
            m->n_tmat = n;
        else
            E_FATAL("Unknown header line: %s\n", buf);
    } while ((n_ci < 0) || (n_tri < 0) || (n_map < 0) ||
             (m->n_ci_sen < 0) || (m->n_sen < 0) || (m->n_tmat < 0));

    if ((n_ci == 0) || (m->n_ci_sen == 0) || (m->n_tmat == 0)
        || (m->n_ci_sen > m->n_sen))
        E_FATAL("%s: Error in header\n", mdeffile);

    /* Check typesize limits */
    if (n_ci >= MAX_INT16)
        E_FATAL("%s: #CI phones (%d) exceeds limit (%d)\n", mdeffile, n_ci,
                MAX_INT16);
    if ((int64)n_ci + n_tri >= MAX_INT32)
        E_FATAL("%s: #Phones (%d) exceeds limit (%d)\n", mdeffile,
                n_ci + n_tri, MAX_INT32);
    if (m->n_sen >= MAX_INT16)
        E_FATAL("%s: #senones (%d) exceeds limit (%d)\n", mdeffile,
                m->n_sen, MAX_INT16);
    if (m->n_tmat >= MAX_INT32) /* Comparison is always false... */
        E_FATAL("%s: #tmats (%d) exceeds limit (%d)\n", mdeffile,
                m->n_tmat, MAX_INT32);

    m->n_emit_state = (n_map / (n_ci + n_tri)) - 1;
    if ((m->n_emit_state + 1) * (n_ci + n_tri) != n_map)
        E_FATAL
            ("Header error: n_state_map not a multiple of n_ci*n_tri\n");

    /* Initialize ciphone info */
    m->n_ciphone = n_ci;
    m->ciphone_ht = hash_table_new(n_ci, HASH_CASE_YES);  /* With case-insensitive string names *//* freed in mdef_free */
    m->ciphone = (ciphone_t *) ckd_calloc(n_ci, sizeof(ciphone_t));     /* freed in mdef_free */

    /* Initialize phones info (ciphones + triphones) */
    m->n_phone = n_ci + n_tri;
    m->phone = (phone_t *) ckd_calloc(m->n_phone, sizeof(phone_t));     /* freed in mdef_free */

    /* Allocate space for state->senone map for each phone */
    senmap = ckd_calloc_2d(m->n_phone, m->n_emit_state, sizeof(**senmap));      /* freed in mdef_free */
    m->sseq = senmap;           /* TEMPORARY; until it is compressed into just the unique ones */

    /* Allocate initial space for <ci,lc,rc,wpos> -> pid mapping */
    m->wpos_ci_lclist = (ph_lc_t ***) ckd_calloc_2d(N_WORD_POSN, m->n_ciphone, sizeof(ph_lc_t *));      /* freed in mdef_free */

    /*
     * Read base phones and triphones.  They'll simply be assigned a running sequence
     * number as their "phone-id".  If the phone-id < n_ci, it's a ciphone.
     */

    /* Read base phones */
    for (p = 0; p < n_ci; p++) {
        if (noncomment_line(buf, sizeof(buf), fp) < 0)
            E_FATAL("Premature EOF reading CIphone %d\n", p);
        parse_base_line(m, buf, p);
    }
    m->sil = mdef_ciphone_id(m, S3_SILENCE_CIPHONE);

    /* Read triphones, if any */
    for (; p < m->n_phone; p++) {
        if (noncomment_line(buf, sizeof(buf), fp) < 0)
            E_FATAL("Premature EOF reading phone %d\n", p);
        parse_tri_line(m, buf, p);
    }

    if (noncomment_line(buf, sizeof(buf), fp) >= 0)
        E_ERROR("Non-empty file beyond expected #phones (%d)\n",
                m->n_phone);

    /* Build CD senones to CI senones map */
    if (m->n_ciphone * m->n_emit_state != m->n_ci_sen)
        E_FATAL
            ("#CI-senones(%d) != #CI-phone(%d) x #emitting-states(%d)\n",
             m->n_ci_sen, m->n_ciphone, m->n_emit_state);
    m->cd2cisen = (int16 *) ckd_calloc(m->n_sen, sizeof(*m->cd2cisen)); /* freed in mdef_free */

    m->sen2cimap = (int16 *) ckd_calloc(m->n_sen, sizeof(*m->sen2cimap)); /* freed in mdef_free */

    for (s = 0; s < m->n_sen; s++)
        m->sen2cimap[s] = -1;
    for (s = 0; s < m->n_ci_sen; s++) { /* CI senones */
        m->cd2cisen[s] = s;
        m->sen2cimap[s] = s / m->n_emit_state;
    }
    for (p = n_ci; p < m->n_phone; p++) {       /* CD senones */
        for (s = 0; s < m->n_emit_state; s++) {
            cd = m->sseq[p][s];
            ci = m->sseq[m->phone[p].ci][s];
            m->cd2cisen[cd] = ci;
            m->sen2cimap[cd] = m->phone[p].ci;
        }
    }

    sseq_compress(m);
    fclose(fp);

    return m;
}